

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VConstrMask(N_Vector C,N_Vector X,N_Vector M,sunindextype param_4,int myid)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  sunrealtype sVar10;
  double dVar11;
  double dVar12;
  timespec spec;
  int local_70;
  timespec local_40;
  
  if (param_4 < 7) {
    printf("Error Test_N_VConstrMask: Local vector length is %ld, length must be >= 7\n",param_4);
    local_70 = 1;
  }
  else {
    uVar8 = 0;
    do {
      set_element(M,uVar8,-1.0);
      sVar10 = (sunrealtype)(&DAT_00114f28)[uVar8 % 7];
      set_element(C,uVar8,(sunrealtype)(&DAT_00114ef0)[uVar8 % 7]);
      set_element(X,uVar8,sVar10);
      uVar8 = uVar8 + 1;
    } while (param_4 != uVar8);
    local_70 = 1;
    clock_gettime(1,&local_40);
    lVar5 = local_40.tv_sec - base_time_tv_sec;
    dVar11 = (double)local_40.tv_nsec;
    iVar3 = N_VConstrMask(C,X,M);
    sync_device(X);
    clock_gettime(1,&local_40);
    lVar6 = local_40.tv_sec - base_time_tv_sec;
    dVar12 = (double)local_40.tv_nsec;
    iVar4 = check_ans(0.0,M,param_4);
    if ((iVar4 == 0) && (iVar3 != 0)) {
      if (myid == 0) {
        local_70 = 0;
        puts("PASSED test -- N_VConstrMask Case 1 ");
      }
      else {
        local_70 = 0;
      }
    }
    else {
      printf(">>> FAILED test -- N_VConstrMask Case 1, Proc %d \n",(ulong)(uint)myid);
    }
    max_time(X,(dVar12 / 1000000000.0 + (double)lVar6) - (dVar11 / 1000000000.0 + (double)lVar5));
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VConstrMask");
    }
    uVar8 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar8;
      uVar7 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8) * 2 & 0xfffffffffffffff8;
      set_element(M,uVar8,-1.0);
      sVar10 = *(sunrealtype *)((long)&DAT_00114f88 + uVar8 * 8 + uVar7 * -5);
      set_element(C,uVar8,*(sunrealtype *)((long)&DAT_00114f60 + uVar8 * 8 + uVar7 * -5));
      set_element(X,uVar8,sVar10);
      uVar8 = uVar8 + 1;
    } while (param_4 != uVar8);
    clock_gettime(1,&local_40);
    lVar5 = local_40.tv_sec - base_time_tv_sec;
    dVar11 = (double)local_40.tv_nsec;
    iVar3 = N_VConstrMask(C,X,M);
    sync_device(X);
    clock_gettime(1,&local_40);
    lVar6 = local_40.tv_sec - base_time_tv_sec;
    uVar8 = 0;
    bVar2 = false;
    do {
      sVar10 = get_element(M,uVar8);
      if ((uVar8 / 5) * 5 + 2 == uVar8) {
        bVar9 = sVar10 == 0.0;
      }
      else {
        bVar9 = sVar10 == 1.0;
      }
      if ((!bVar9) || (NAN(sVar10))) {
        bVar2 = true;
      }
      uVar8 = uVar8 + 1;
    } while (param_4 != uVar8);
    if (bVar2 || iVar3 != 0) {
      printf(">>> FAILED test -- N_VConstrMask Case 2, Proc %d \n",(ulong)(uint)myid);
      local_70 = local_70 + 1;
    }
    else if (myid == 0) {
      puts("PASSED test -- N_VConstrMask Case 2 ");
    }
    max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar6) -
               (dVar11 / 1000000000.0 + (double)lVar5));
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VConstrMask");
    }
  }
  return local_70;
}

Assistant:

int Test_N_VConstrMask(N_Vector C, N_Vector X, N_Vector M,
                       sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype i;
  sunbooleantype test;

  if (local_length < 7)
  {
    printf("Error Test_N_VConstrMask: Local vector length is %ld, length must "
           "be >= 7\n",
           (long int)local_length);
    return (1);
  }

  /*
   * Case 1: Return True
   */

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(M, i, NEG_ONE);

    switch (i % 7)
    {
    case 0:
      /* c = -2, test for < 0*/
      set_element(C, i, NEG_TWO);
      set_element(X, i, NEG_TWO);
      break;

    case 1:
      /* c = -1, test for <= 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, NEG_ONE);
      break;

    case 2:
      /* c = -1, test for == 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, ZERO);
      break;

    case 3:
      /* c = 0, no test */
      set_element(C, i, ZERO);
      set_element(X, i, HALF);
      break;

    case 4:
      /* c = 1, test for == 0*/
      set_element(C, i, ONE);
      set_element(X, i, ZERO);
      break;

    case 5:
      /* c = 1, test for >= 0*/
      set_element(C, i, ONE);
      set_element(X, i, ONE);
      break;

    case 6:
      /* c = 2, test for > 0 */
      set_element(C, i, TWO);
      set_element(X, i, TWO);
      break;
    }
  }

  start_time = get_time();
  test       = N_VConstrMask(C, X, M);
  sync_device(X);
  stop_time = get_time();

  /* M should be vector of 0 */
  failure = check_ans(ZERO, M, local_length);

  if (failure || !test)
  {
    printf(">>> FAILED test -- N_VConstrMask Case 1, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VConstrMask Case 1 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VConstrMask", maxt);

  /*
   * Case 2: Return False
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(M, i, NEG_ONE);

    switch (i % 5)
    {
    case 0:
      /* c = -2, test for < 0*/
      set_element(C, i, NEG_TWO);
      set_element(X, i, TWO);
      break;

    case 1:
      /* c = -1, test for <= 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, ONE);
      break;

    case 2:
      /* c = 0, no test */
      set_element(C, i, ZERO);
      set_element(X, i, HALF);
      break;

    case 3:
      /* c = 1, test for >= 0*/
      set_element(C, i, ONE);
      set_element(X, i, NEG_ONE);
      break;

    case 4:
      /* c = 2, test for > 0 */
      set_element(C, i, TWO);
      set_element(X, i, NEG_TWO);
      break;
    }
  }

  start_time = get_time();
  test       = N_VConstrMask(C, X, M);
  sync_device(X);
  stop_time = get_time();

  /* check mask vector */
  for (i = 0; i < local_length; i++)
  {
    if ((i % 5) == 2)
    {
      if (get_element(M, i) != ZERO) { failure = 1; }
    }
    else
    {
      if (get_element(M, i) != ONE) { failure = 1; }
    }
  }

  if (failure || test)
  {
    printf(">>> FAILED test -- N_VConstrMask Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VConstrMask Case 2 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VConstrMask", maxt);

  return (fails);
}